

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O0

size_t __thiscall CLI::App::count(App *this,string *name)

{
  bool bVar1;
  pointer pOVar2;
  size_t sVar3;
  OptionNotFound *this_00;
  string local_88;
  string local_58;
  reference local_38;
  Option_p *opt;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
  *__range2;
  string *name_local;
  App *this_local;
  
  __end2 = std::
           vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ::begin(&this->options_);
  opt = (Option_p *)
        std::
        vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ::end(&this->options_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
                                *)&opt);
    if (!bVar1) {
      this_00 = (OptionNotFound *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_88,(string *)name);
      OptionNotFound::OptionNotFound(this_00,&local_88);
      __cxa_throw(this_00,&OptionNotFound::typeinfo,OptionNotFound::~OptionNotFound);
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
               ::operator*(&__end2);
    pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_38);
    ::std::__cxx11::string::string((string *)&local_58,(string *)name);
    bVar1 = Option::check_name(pOVar2,&local_58);
    ::std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
    ::operator++(&__end2);
  }
  pOVar2 = std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>::operator->(local_38);
  sVar3 = Option::count(pOVar2);
  return sVar3;
}

Assistant:

size_t count(std::string name) const {
        for(const Option_p &opt : options_) {
            if(opt->check_name(name)) {
                return opt->count();
            }
        }
        throw OptionNotFound(name);
    }